

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void nn_hash_insert(nn_hash *self,uint32_t key,nn_hash_item *item)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  nn_list_item *pnVar4;
  nn_list *pnVar5;
  uint uVar6;
  ulong uVar7;
  nn_list *pnVar8;
  
  uVar2 = nn_hash_key(key);
  uVar7 = (ulong)uVar2 % (ulong)self->slots;
  pnVar8 = self->array;
  pnVar4 = pnVar8[uVar7].first;
  do {
    if (pnVar4 == (nn_list_item *)0x0) {
      item->key = key;
      nn_list_insert(pnVar8 + uVar7,&item->list,(nn_list_item *)0x0);
      uVar1 = self->slots;
      uVar2 = self->items;
      self->items = uVar2 + 1;
      if ((int)uVar1 < 0 || uVar2 * 2 + 2 <= uVar1) {
        return;
      }
      pnVar8 = self->array;
      uVar6 = uVar1 * 2;
      self->slots = uVar6;
      pnVar5 = (nn_list *)malloc((ulong)uVar1 << 5);
      self->array = pnVar5;
      if (pnVar5 != (nn_list *)0x0) {
        for (uVar3 = 0; uVar3 != uVar6; uVar3 = uVar3 + 1) {
          pnVar5 = self->array;
          pnVar5[uVar3].first = (nn_list_item *)0x0;
          pnVar5[uVar3].last = (nn_list_item *)0x0;
          uVar6 = self->slots;
        }
        for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
          pnVar5 = pnVar8 + uVar7;
          while (pnVar4 = pnVar5->first, pnVar4 != (nn_list_item *)0x0) {
            nn_list_erase(pnVar5,pnVar4);
            uVar2 = nn_hash_key(*(uint32_t *)&pnVar4[-1].prev);
            nn_list_insert(self->array + (ulong)uVar2 % (ulong)self->slots,pnVar4,
                           (nn_list_item *)0x0);
          }
          nn_list_term(pnVar5);
        }
        free(pnVar8);
        return;
      }
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/utils/hash.c"
              ,0x43);
LAB_0010158e:
      fflush(_stderr);
      nn_err_abort();
    }
    if (*(uint32_t *)&pnVar4[-1].prev == key) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "nn_cont (it, struct nn_hash_item, list)->key != key",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/utils/hash.c"
              ,0x65);
      goto LAB_0010158e;
    }
    pnVar4 = nn_list_next(pnVar8,pnVar4);
    pnVar8 = self->array;
  } while( true );
}

Assistant:

void nn_hash_insert (struct nn_hash *self, uint32_t key,
    struct nn_hash_item *item)
{
    struct nn_list_item *it;
    uint32_t i;

    i = nn_hash_key (key) % self->slots;

    for (it = nn_list_begin (&self->array [i]);
          it != nn_list_end (&self->array [i]);
          it = nn_list_next (&self->array [i], it))
        nn_assert (nn_cont (it, struct nn_hash_item, list)->key != key);

    item->key = key;
    nn_list_insert (&self->array [i], &item->list,
        nn_list_end (&self->array [i]));
    ++self->items;

    /*  If the hash is getting full, double the amount of slots and
        re-hash all the items. */
    if (nn_slow (self->items * 2 > self->slots && self->slots < 0x80000000))
    nn_hash_rehash(self);
}